

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O2

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::
Construct<Diligent::ShaderVkImpl,Diligent::RayTracingPipelineStateCreateInfo>
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,
          RayTracingPipelineStateCreateInfo *CreateInfo)

{
  IThreadPool *pThreadPool;
  pointer ppSVar1;
  undefined8 __p;
  pointer pSVar2;
  pointer pSVar3;
  pointer ppSVar4;
  vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_> Shaders;
  undefined1 local_2a8 [12];
  SHADER_TYPE ActiveShaderStages;
  TShaderStages ShaderStages;
  vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
  ShaderCompileTasks;
  vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
  StageShaders;
  RayTracingPipelineStateCreateInfoX local_238;
  
  LOCK();
  (this->m_Status)._M_i = PIPELINE_STATE_STATUS_COMPILING;
  UNLOCK();
  if ((((CreateInfo->super_PipelineStateCreateInfo).Flags & PSO_CREATE_FLAG_ASYNCHRONOUS) ==
       PSO_CREATE_FLAG_NONE) ||
     ((((this->
        super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
        ).m_pDevice)->
      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
      ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_pShaderCompilationThreadPool.
      m_pObject == (IThreadPool *)0x0)) {
    PipelineStateVkImpl::InitializePipeline((PipelineStateVkImpl *)this,CreateInfo);
    LOCK();
    (this->m_Status)._M_i = PIPELINE_STATE_STATUS_READY;
    UNLOCK();
  }
  else {
    ShaderStages.
    super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ShaderStages.
    super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ShaderStages.
    super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ActiveShaderStages = SHADER_TYPE_UNKNOWN;
    PipelineStateUtils::
    ExtractShaders<Diligent::ShaderVkImpl,std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>>>
              (CreateInfo,&ShaderStages,false,&ActiveShaderStages);
    pSVar2 = ShaderStages.
             super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    Shaders.
    super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Shaders.
    super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    Shaders.
    super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (pSVar3 = ShaderStages.
                  super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppSVar1 = Shaders.
                  super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish, pSVar3 != pSVar2; pSVar3 = pSVar3 + 1)
    {
      std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>::
      vector((vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
              *)&StageShaders.
                 super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
             ,&pSVar3->Shaders);
      std::vector<Diligent::ShaderVkImpl_const*,std::allocator<Diligent::ShaderVkImpl_const*>>::
      insert<__gnu_cxx::__normal_iterator<Diligent::ShaderVkImpl_const**,std::vector<Diligent::ShaderVkImpl_const*,std::allocator<Diligent::ShaderVkImpl_const*>>>,void>
                ((vector<Diligent::ShaderVkImpl_const*,std::allocator<Diligent::ShaderVkImpl_const*>>
                  *)&Shaders,
                 (const_iterator)
                 Shaders.
                 super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<const_Diligent::ShaderVkImpl_**,_std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>_>
                  )StageShaders.
                   super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<const_Diligent::ShaderVkImpl_**,_std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>_>
                  )StageShaders.
                   super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      std::
      _Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
      ::~_Vector_base(&StageShaders.
                       super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                     );
    }
    ShaderCompileTasks.
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ShaderCompileTasks.
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ShaderCompileTasks.
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (ppSVar4 = Shaders.
                   super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppSVar4 != ppSVar1;
        ppSVar4 = ppSVar4 + 1) {
      AsyncInitializer::GetAsyncTask
                ((AsyncInitializer *)&StageShaders,
                 &((*ppSVar4)->super_ShaderBase<Diligent::EngineVkImplTraits>).m_AsyncInitializer);
      if (StageShaders.
          super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        std::
        vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>>>
        ::emplace_back<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>>
                  ((vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>>>
                    *)&ShaderCompileTasks,(RefCntAutoPtr<Diligent::IAsyncTask> *)&StageShaders);
      }
      RefCntAutoPtr<Diligent::IAsyncTask>::Release
                ((RefCntAutoPtr<Diligent::IAsyncTask> *)&StageShaders);
    }
    pThreadPool = (((this->
                    super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                    ).m_pDevice)->
                  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.
                  m_pShaderCompilationThreadPool.m_pObject;
    StageShaders.
    super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)this;
    std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>::
    vector((vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
            *)&StageShaders.
               super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,&Shaders);
    RayTracingPipelineStateCreateInfoX::RayTracingPipelineStateCreateInfoX(&local_238,CreateInfo);
    AsyncInitializer::
    Start<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::Construct<Diligent::ShaderVkImpl,Diligent::RayTracingPipelineStateCreateInfo>(Diligent::RayTracingPipelineStateCreateInfo_const&)::_lambda(unsigned_int)_1_>
              ((AsyncInitializer *)local_2a8,pThreadPool,&ShaderCompileTasks,
               (anon_class_552_3_1ef41722_for_Handler *)&StageShaders);
    __p = local_2a8._0_8_;
    local_2a8._0_8_ =
         (__uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
          )0x0;
    std::
    __uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>::
    reset((__uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
           *)&this->m_AsyncInitializer,(pointer)__p);
    std::unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>::
    ~unique_ptr((unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
                 *)local_2a8);
    Construct<Diligent::ShaderVkImpl,Diligent::RayTracingPipelineStateCreateInfo>(Diligent::RayTracingPipelineStateCreateInfo_const&)
    ::{lambda(unsigned_int)#1}::~Construct((_lambda_unsigned_int__1_ *)&StageShaders);
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IAsyncTask>_>_>
    ::~vector(&ShaderCompileTasks);
    std::
    _Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>::
    ~_Vector_base(&Shaders.
                   super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                 );
    std::
    vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
    ::~vector(&ShaderStages);
  }
  return;
}

Assistant:

void Construct(const PSOCreateInfoType& CreateInfo)
    {
        PipelineStateImplType* const pThisImpl = static_cast<PipelineStateImplType*>(this);

        m_Status.store(PIPELINE_STATE_STATUS_COMPILING);
        if ((CreateInfo.Flags & PSO_CREATE_FLAG_ASYNCHRONOUS) != 0 && this->m_pDevice->GetShaderCompilationThreadPool() != nullptr)
        {
            // Collect all asynchronous shader compile tasks
            typename PipelineStateImplType::TShaderStages ShaderStages;
            SHADER_TYPE                                   ActiveShaderStages    = SHADER_TYPE_UNKNOWN;
            constexpr bool                                WaitUntilShadersReady = false;
            PipelineStateUtils::ExtractShaders<ShaderImplType>(CreateInfo, ShaderStages, WaitUntilShadersReady, ActiveShaderStages);

            std::vector<const ShaderImplType*> Shaders;
            for (const auto& Stage : ShaderStages)
            {
                std::vector<const ShaderImplType*> StageShaders = GetStageShaders(Stage);
                Shaders.insert(Shaders.end(), StageShaders.begin(), StageShaders.end());
            }

            std::vector<RefCntAutoPtr<IAsyncTask>> ShaderCompileTasks;
            for (const ShaderImplType* pShader : Shaders)
            {
                if (RefCntAutoPtr<IAsyncTask> pCompileTask = pShader->GetCompileTask())
                    ShaderCompileTasks.emplace_back(std::move(pCompileTask));
            }

            m_AsyncInitializer = AsyncInitializer::Start(
                this->m_pDevice->GetShaderCompilationThreadPool(),
                ShaderCompileTasks, // Make sure that all asynchronous shader compile tasks are completed first
                [pThisImpl,
#ifdef DILIGENT_DEBUG
                 Shaders,
#endif
                 CreateInfo = typename PipelineStateCreateInfoXTraits<PSOCreateInfoType>::CreateInfoXType{CreateInfo}](Uint32 ThreadId) mutable //
                {
#ifdef DILIGENT_DEBUG
                    for (const ShaderImplType* pShader : Shaders)
                    {
                        VERIFY(!pShader->IsCompiling(), "All shader compile tasks must have been completed since we used them as "
                                                        "prerequisites for the pipeline initialization task. This appears to be a bug.");
                    }
#endif
                    try
                    {
                        pThisImpl->InitializePipeline(CreateInfo);
                        pThisImpl->m_Status.store(PIPELINE_STATE_STATUS_READY);
                    }
                    catch (...)
                    {
                        pThisImpl->m_Status.store(PIPELINE_STATE_STATUS_FAILED);
                    }

                    // Release create info objects
                    CreateInfo.Clear();
                });
        }
        else
        {
            try
            {
                pThisImpl->InitializePipeline(CreateInfo);
                m_Status.store(PIPELINE_STATE_STATUS_READY);
            }
            catch (...)
            {
                pThisImpl->Destruct();
                throw;
            }
        }
    }